

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_for_of_start(JSContext *ctx,JSValue *sp,BOOL is_async)

{
  JSValue v;
  int iVar1;
  JSValueUnion *in_RSI;
  JSValue JVar2;
  int64_t unaff_retaddr;
  JSValue method;
  JSValue obj;
  JSValue op1;
  JSAtom in_stack_000000ac;
  JSContext *in_stack_000000b0;
  undefined1 in_stack_000000b8 [16];
  undefined1 in_stack_000000c8 [16];
  BOOL in_stack_00000150;
  JSContext *in_stack_ffffffffffffff60;
  JSValueUnion in_stack_ffffffffffffff68;
  int64_t in_stack_ffffffffffffff70;
  JSValueUnion local_88;
  JSValueUnion local_80;
  int local_30;
  undefined8 in_stack_ffffffffffffffe8;
  JSContext *in_stack_fffffffffffffff0;
  JSValueUnion in_stack_fffffffffffffff8;
  
  JVar2.tag = unaff_retaddr;
  JVar2.u.float64 = in_stack_fffffffffffffff8.float64;
  JVar2 = JS_GetIterator(in_stack_fffffffffffffff0,JVar2,
                         (BOOL)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  local_88 = JVar2.u;
  local_80 = (JSValueUnion)JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    v.tag = in_stack_ffffffffffffff70;
    v.u.float64 = in_stack_ffffffffffffff68.float64;
    JS_FreeValue(in_stack_ffffffffffffff60,v);
    in_RSI[-2] = local_88;
    in_RSI[-1] = local_80;
    JVar2 = JS_GetPropertyInternal
                      (in_stack_000000b0,(JSValue)in_stack_000000c8,in_stack_000000ac,
                       (JSValue)in_stack_000000b8,in_stack_00000150);
    iVar1 = JS_IsException(JVar2);
    if (iVar1 == 0) {
      *in_RSI = JVar2.u;
      in_RSI[1] = (JSValueUnion)JVar2.tag;
      local_30 = 0;
    }
    else {
      local_30 = -1;
    }
  }
  else {
    local_30 = -1;
  }
  return local_30;
}

Assistant:

static __exception int js_for_of_start(JSContext *ctx, JSValue *sp,
                                       BOOL is_async)
{
    JSValue op1, obj, method;
    op1 = sp[-1];
    obj = JS_GetIterator(ctx, op1, is_async);
    if (JS_IsException(obj))
        return -1;
    JS_FreeValue(ctx, op1);
    sp[-1] = obj;
    method = JS_GetProperty(ctx, obj, JS_ATOM_next);
    if (JS_IsException(method))
        return -1;
    sp[0] = method;
    return 0;
}